

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O0

int mdef_phone_id(mdef_t *m,int ci,int lc,int rc,word_posn_t wpos)

{
  ph_lc_t *ppVar1;
  ph_rc_t *ppVar2;
  int local_48;
  int local_44;
  int newr;
  int newl;
  ph_rc_t *rcptr;
  ph_lc_t *lcptr;
  word_posn_t wpos_local;
  int rc_local;
  int lc_local;
  int ci_local;
  mdef_t *m_local;
  
  if (m == (mdef_t *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                  ,0xdf,"int mdef_phone_id(mdef_t *, int, int, int, word_posn_t)");
  }
  if ((ci < 0) || (m->n_ciphone <= ci)) {
    __assert_fail("(ci >= 0) && (ci < m->n_ciphone)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                  ,0xe0,"int mdef_phone_id(mdef_t *, int, int, int, word_posn_t)");
  }
  if ((lc < 0) || (m->n_ciphone <= lc)) {
    __assert_fail("(lc >= 0) && (lc < m->n_ciphone)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                  ,0xe1,"int mdef_phone_id(mdef_t *, int, int, int, word_posn_t)");
  }
  if ((-1 < rc) && (rc < m->n_ciphone)) {
    if (WORD_POSN_SINGLE < wpos) {
      __assert_fail("(wpos >= 0) && (wpos < N_WORD_POSN)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                    ,0xe3,"int mdef_phone_id(mdef_t *, int, int, int, word_posn_t)");
    }
    ppVar1 = find_ph_lc(m->wpos_ci_lclist[wpos][ci],lc);
    if ((ppVar1 == (ph_lc_t *)0x0) ||
       (ppVar2 = find_ph_rc(ppVar1->rclist,rc), ppVar2 == (ph_rc_t *)0x0)) {
      if (m->sil < 0) {
        m_local._4_4_ = -1;
      }
      else {
        local_44 = lc;
        if (m->ciphone[lc].filler != 0) {
          local_44 = (int)m->sil;
        }
        local_48 = rc;
        if (m->ciphone[rc].filler != 0) {
          local_48 = (int)m->sil;
        }
        if ((local_44 == lc) && (local_48 == rc)) {
          m_local._4_4_ = -1;
        }
        else {
          m_local._4_4_ = mdef_phone_id(m,ci,local_44,local_48,wpos);
        }
      }
    }
    else {
      m_local._4_4_ = ppVar2->pid;
    }
    return m_local._4_4_;
  }
  __assert_fail("(rc >= 0) && (rc < m->n_ciphone)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                ,0xe2,"int mdef_phone_id(mdef_t *, int, int, int, word_posn_t)");
}

Assistant:

int
mdef_phone_id(mdef_t * m,
              int ci, int lc, int rc, word_posn_t wpos)
{
    ph_lc_t *lcptr;
    ph_rc_t *rcptr;
    int newl, newr;

    assert(m);
    assert((ci >= 0) && (ci < m->n_ciphone));
    assert((lc >= 0) && (lc < m->n_ciphone));
    assert((rc >= 0) && (rc < m->n_ciphone));
    assert((wpos >= 0) && (wpos < N_WORD_POSN));

    if (((lcptr =
          find_ph_lc(m->wpos_ci_lclist[wpos][(int) ci], lc)) == NULL)
        || ((rcptr = find_ph_rc(lcptr->rclist, rc)) == NULL)) {
        /* Not found; backoff to silence context if non-silence filler context */
        if (m->sil < 0)
            return -1;

        newl = m->ciphone[(int) lc].filler ? m->sil : lc;
        newr = m->ciphone[(int) rc].filler ? m->sil : rc;
        if ((newl == lc) && (newr == rc))
            return -1;

        return (mdef_phone_id(m, ci, newl, newr, wpos));
    }

    return (rcptr->pid);
}